

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

long data_cb_resampler(cubeb_stream *param_1,void *user_ptr,void *input_buffer,void *output_buffer,
                      long frame_count)

{
  uint32_t uVar1;
  uint *puVar2;
  auto_array<float> *in_RCX;
  long in_RSI;
  uint32_t in_R8D;
  uint32_t to_write;
  uint32_t remaining;
  float *out;
  float *in;
  osc_state *state;
  uint32_t in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t channels;
  uint in_stack_ffffffffffffffbc;
  
  auto_array<float>::push
            (in_RCX,(float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  uVar1 = *(int *)(in_RSI + 4) - *(int *)(in_RSI + 8);
  puVar2 = std::min<unsigned_int>((uint *)&stack0xffffffffffffffbc,(uint *)&stack0xffffffffffffffb4)
  ;
  channels = *puVar2;
  uVar1 = fill_with_sine((float *)in_RCX,uVar1,channels,in_R8D,in_stack_ffffffffffffffb0);
  *(uint32_t *)(in_RSI + 8) = uVar1;
  return (ulong)channels;
}

Assistant:

long data_cb_resampler(cubeb_stream * /*stm*/, void * user_ptr,
             const void * input_buffer, void * output_buffer, long frame_count)
{
  osc_state * state = reinterpret_cast<osc_state*>(user_ptr);
  const float * in = reinterpret_cast<const float*>(input_buffer);
  float * out = reinterpret_cast<float*>(output_buffer);

  state->input.push(in, frame_count * state->input_channels);

  /* Check how much output frames we need to write */
  uint32_t remaining = state->max_output_phase_index - state->output_phase_index;
  uint32_t to_write = std::min<uint32_t>(remaining, frame_count);
  state->output_phase_index = fill_with_sine(out,
                                             state->target_rate,
                                             state->output_channels,
                                             to_write,
                                             state->output_phase_index);

  return to_write;
}